

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTriangles.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderTrianglesInnerTessellationLevelRounding::runTestIterations
          (TessellationShaderTrianglesInnerTessellationLevelRounding *this)

{
  _tessellation_shader_vertex_spacing vertex_spacing;
  pointer pcVar1;
  pointer pcVar2;
  int iVar3;
  GLenum err;
  uint uVar4;
  uint uVar5;
  undefined4 extraout_var;
  TessellationShaderUtils *this_00;
  long lVar6;
  TestError *pTVar7;
  NotSupportedError *this_01;
  _tessellation_shader_vertex_spacing vertex_spacing_00;
  long lVar8;
  value_type local_270;
  GLint gl_max_tess_gen_level_value;
  string vs_mode_string;
  GLint tess_levels [3];
  undefined1 local_1b8 [8];
  _func_int **pp_Stack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  ios_base local_140 [272];
  Functions *gl;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"Tessellation shader functionality not supported, skipping","");
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1b8);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  this_00 = (TessellationShaderUtils *)operator_new(0x20);
  TessellationShaderUtils::TessellationShaderUtils(this_00,gl,&this->super_TestCaseBase);
  this->m_utils = this_00;
  gl_max_tess_gen_level_value = 0;
  (*gl->getIntegerv)((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,
                     &gl_max_tess_gen_level_value);
  err = (*gl->getError)();
  glu::checkError(err,"glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                  ,0x3ad);
  tess_levels[0] = 2;
  tess_levels[1] = gl_max_tess_gen_level_value / 2;
  tess_levels[2] = gl_max_tess_gen_level_value;
  lVar6 = 0;
  do {
    vertex_spacing = (&DAT_01b313c4)[lVar6];
    lVar8 = 0;
    do {
      iVar3 = tess_levels[lVar8];
      local_270.set2_inner[0] = 0.0;
      local_270.set2_inner[1] = 0.0;
      local_270.set2_outer[0] = 0.0;
      local_270.set2_outer[1] = 0.0;
      local_270.set1_outer[0] = 0.0;
      local_270.set1_outer[1] = 0.0;
      local_270.set1_outer[2] = 0.0;
      local_270.set1_outer[3] = 0.0;
      local_270.set2_outer[2] = 0.0;
      local_270.set2_outer[3] = 0.0;
      local_270.set2_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_270.set2_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_270.set1_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_270.set2_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_270.set1_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_270.set1_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_270.n_vertices = 0;
      local_270.vertex_spacing = TESSELLATION_SHADER_VERTEX_SPACING_COUNT;
      local_270.set1_inner[0] = 1.0;
      local_270.set1_inner[1] = 0.0;
      TessellationShaderUtils::getTessellationLevelAfterVertexSpacing
                (vertex_spacing,1.5,gl_max_tess_gen_level_value,(float *)0x0,local_270.set2_inner);
      local_270.set1_outer[0] = (float)iVar3;
      local_270.vertex_spacing = vertex_spacing;
      local_270.set1_outer[2] = local_270.set1_outer[0];
      local_270.set1_outer[1] = local_270.set1_outer[0];
      local_270.set2_outer[0] = local_270.set1_outer[2];
      local_270.set1_outer[3] = local_270.set1_outer[2];
      local_270.set2_outer[2] = local_270.set2_outer[0];
      local_270.set2_outer[1] = local_270.set2_outer[0];
      local_270.set2_outer[3] = local_270.set2_outer[2];
      uVar4 = TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                        (this->m_utils,TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
                         local_270.set1_inner,local_270.set1_outer,vertex_spacing,false);
      uVar5 = TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                        (this->m_utils,TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
                         local_270.set2_inner,local_270.set2_outer,local_270.vertex_spacing,false);
      if (uVar4 == 0) {
        TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                  (&vs_mode_string,(TessellationShaderUtils *)(ulong)vertex_spacing,
                   vertex_spacing_00);
        local_1b8 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,
                   "No vertices were generated by tessellator for: inner tess levels:[",0x42);
        std::ostream::_M_insert<double>((double)local_270.set1_inner[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_270.set1_inner[1]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,"], outer tess levels:[",0x16);
        std::ostream::_M_insert<double>((double)local_270.set1_outer[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_270.set1_outer[1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_270.set1_outer[2]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_270.set1_outer[3]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,"], primitive mode: triangles, vertex spacing: ",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,vs_mode_string._M_dataplus._M_p,
                   vs_mode_string._M_string_length);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
        std::ios_base::~ios_base(local_140);
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Zero vertices were generated by tessellator for first test pass",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                   ,0x3ef);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (uVar5 == 0) {
        TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                  (&vs_mode_string,(TessellationShaderUtils *)(ulong)vertex_spacing,
                   vertex_spacing_00);
        local_1b8 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,
                   "No vertices were generated by tessellator for: inner tess levels:[",0x42);
        std::ostream::_M_insert<double>((double)local_270.set2_inner[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_270.set2_inner[1]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,"], outer tess levels:[",0x16);
        std::ostream::_M_insert<double>((double)local_270.set2_outer[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_270.set2_outer[1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_270.set2_outer[2]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_270.set2_outer[3]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,"], primitive mode: triangles, vertex spacing: ",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,vs_mode_string._M_dataplus._M_p,
                   vs_mode_string._M_string_length);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
        std::ios_base::~ios_base(local_140);
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Zero vertices were generated by tessellator for second test pass",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                   ,0x402);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (uVar4 != uVar5) {
        TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                  (&vs_mode_string,(TessellationShaderUtils *)(ulong)vertex_spacing,
                   vertex_spacing_00);
        local_1b8 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,
                   "Amount of vertices generated by the tessellator differs for the following inner/outer configs: inner tess levels:["
                   ,0x72);
        std::ostream::_M_insert<double>((double)local_270.set1_inner[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_270.set1_inner[1]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,"], outer tess levels:[",0x16);
        std::ostream::_M_insert<double>((double)local_270.set1_outer[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_270.set1_outer[1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_270.set1_outer[2]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_270.set1_outer[3]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,"] and inner tess levels:[",0x19);
        std::ostream::_M_insert<double>((double)local_270.set2_inner[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_270.set2_inner[1]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,"], outer tess levels:[",0x16);
        std::ostream::_M_insert<double>((double)local_270.set2_outer[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_270.set2_outer[1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_270.set2_outer[2]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_270.set2_outer[3]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,"], primitive mode: triangles, vertex spacing: ",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,vs_mode_string._M_dataplus._M_p,
                   vs_mode_string._M_string_length);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
        std::ios_base::~ios_base(local_140);
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,
                   "Amount of vertices generated by tessellator differs between base and references passes"
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                   ,0x41c);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      local_270.n_vertices = uVar4;
      TessellationShaderUtils::getDataGeneratedByTessellator
                ((vector<char,_std::allocator<char>_> *)local_1b8,this->m_utils,local_270.set1_inner
                 ,false,TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
                 TESSELLATION_SHADER_VERTEX_ORDERING_CCW,local_270.vertex_spacing,
                 local_270.set1_outer);
      pcVar2 = local_270.set1_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pcVar1 = local_270.set1_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_270.set1_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_1b8;
      local_270.set1_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pp_Stack_1b0;
      local_270.set1_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_1a8[0]._0_8_;
      local_1b8 = (undefined1  [8])0x0;
      pp_Stack_1b0 = (_func_int **)0x0;
      local_1a8[0]._M_allocated_capacity = (pointer)0x0;
      if (pcVar1 != (pointer)0x0) {
        operator_delete(pcVar1,(long)pcVar2 - (long)pcVar1);
        if (local_1b8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_1b8,local_1a8[0]._M_allocated_capacity - (long)local_1b8);
        }
      }
      TessellationShaderUtils::getDataGeneratedByTessellator
                ((vector<char,_std::allocator<char>_> *)local_1b8,this->m_utils,local_270.set2_inner
                 ,false,TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
                 TESSELLATION_SHADER_VERTEX_ORDERING_CCW,local_270.vertex_spacing,
                 local_270.set2_outer);
      pcVar2 = local_270.set2_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pcVar1 = local_270.set2_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_270.set2_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_1b8;
      local_270.set2_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pp_Stack_1b0;
      local_270.set2_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_1a8[0]._0_8_;
      local_1b8 = (undefined1  [8])0x0;
      pp_Stack_1b0 = (_func_int **)0x0;
      local_1a8[0]._M_allocated_capacity = (pointer)0x0;
      if (pcVar1 != (pointer)0x0) {
        operator_delete(pcVar1,(long)pcVar2 - (long)pcVar1);
        if (local_1b8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_1b8,local_1a8[0]._M_allocated_capacity - (long)local_1b8);
        }
      }
      std::
      vector<glcts::TessellationShaderTrianglesInnerTessellationLevelRounding::_run,_std::allocator<glcts::TessellationShaderTrianglesInnerTessellationLevelRounding::_run>_>
      ::push_back(&this->m_runs,&local_270);
      if ((TestLog *)
          local_270.set2_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (TestLog *)0x0) {
        operator_delete(local_270.set2_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_270.set2_data.super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_270.set2_data.super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((TestLog *)
          local_270.set1_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (TestLog *)0x0) {
        operator_delete(local_270.set1_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_270.set1_data.super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_270.set1_data.super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar6 = lVar6 + 1;
    if (lVar6 == 3) {
      return;
    }
  } while( true );
}

Assistant:

void TessellationShaderTrianglesInnerTessellationLevelRounding::runTestIterations()
{
	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize Utils instance */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_utils = new TessellationShaderUtils(gl, this);

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Initialize all test runs */
	const glw::GLint   tess_levels[] = { 2, gl_max_tess_gen_level_value / 2, gl_max_tess_gen_level_value };
	const unsigned int n_tess_levels = sizeof(tess_levels) / sizeof(tess_levels[0]);

	const _tessellation_shader_vertex_spacing vs_modes[] = { TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
															 TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN,
															 TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD };
	const unsigned int n_vs_modes = sizeof(vs_modes) / sizeof(vs_modes[0]);

	for (unsigned int n_vs_mode = 0; n_vs_mode < n_vs_modes; ++n_vs_mode)
	{
		_tessellation_shader_vertex_spacing vs_mode = vs_modes[n_vs_mode];

		for (unsigned int n_tess_level = 0; n_tess_level < n_tess_levels; ++n_tess_level)
		{
			/* Set up the run descriptor */
			glw::GLint tess_level = tess_levels[n_tess_level];
			_run	   run;

			run.set1_inner[0] = 1.0f;
			run.set1_inner[1] = 0.0f;
			run.set2_inner[1] = 0.0f;

			TessellationShaderUtils::getTessellationLevelAfterVertexSpacing(vs_mode, 1.5f, gl_max_tess_gen_level_value,
																			DE_NULL, /* out_clamped */
																			run.set2_inner);
			run.set1_outer[0] = (glw::GLfloat)tess_level;
			run.set2_outer[0] = (glw::GLfloat)tess_level;
			run.set1_outer[1] = (glw::GLfloat)tess_level;
			run.set2_outer[1] = (glw::GLfloat)tess_level;
			run.set1_outer[2] = (glw::GLfloat)tess_level;
			run.set2_outer[2] = (glw::GLfloat)tess_level;
			run.set1_outer[3] = (glw::GLfloat)tess_level;
			run.set2_outer[3] = (glw::GLfloat)tess_level;

			run.vertex_spacing = vs_mode;

			/* Retrieve vertex data for both passes */
			glw::GLint n_set1_vertices = 0;
			glw::GLint n_set2_vertices = 0;

			n_set1_vertices = m_utils->getAmountOfVerticesGeneratedByTessellator(
				TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES, run.set1_inner, run.set1_outer, run.vertex_spacing,
				false); /* is_point_mode_enabled */
			n_set2_vertices = m_utils->getAmountOfVerticesGeneratedByTessellator(
				TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES, run.set2_inner, run.set2_outer, run.vertex_spacing,
				false); /* is_point_mode_enabled */

			if (n_set1_vertices == 0)
			{
				std::string vs_mode_string = TessellationShaderUtils::getESTokenForVertexSpacingMode(vs_mode);

				m_testCtx.getLog() << tcu::TestLog::Message << "No vertices were generated by tessellator for: "
															   "inner tess levels:"
															   "["
								   << run.set1_inner[0] << ", " << run.set1_inner[1] << "]"
																						", outer tess levels:"
																						"["
								   << run.set1_outer[0] << ", " << run.set1_outer[1] << ", " << run.set1_outer[2]
								   << ", " << run.set1_outer[3] << "]"
																   ", primitive mode: triangles, "
																   "vertex spacing: "
								   << vs_mode_string << tcu::TestLog::EndMessage;

				TCU_FAIL("Zero vertices were generated by tessellator for first test pass");
			}

			if (n_set2_vertices == 0)
			{
				std::string vs_mode_string = TessellationShaderUtils::getESTokenForVertexSpacingMode(vs_mode);

				m_testCtx.getLog() << tcu::TestLog::Message << "No vertices were generated by tessellator for: "
															   "inner tess levels:"
															   "["
								   << run.set2_inner[0] << ", " << run.set2_inner[1] << "]"
																						", outer tess levels:"
																						"["
								   << run.set2_outer[0] << ", " << run.set2_outer[1] << ", " << run.set2_outer[2]
								   << ", " << run.set2_outer[3] << "]"
																   ", primitive mode: triangles, "
																   "vertex spacing: "
								   << vs_mode_string << tcu::TestLog::EndMessage;

				TCU_FAIL("Zero vertices were generated by tessellator for second test pass");
			}

			if (n_set1_vertices != n_set2_vertices)
			{
				std::string vs_mode_string = TessellationShaderUtils::getESTokenForVertexSpacingMode(vs_mode);

				m_testCtx.getLog() << tcu::TestLog::Message << "Amount of vertices generated by the tessellator differs"
															   " for the following inner/outer configs: "
															   "inner tess levels:"
															   "["
								   << run.set1_inner[0] << ", " << run.set1_inner[1] << "]"
																						", outer tess levels:"
																						"["
								   << run.set1_outer[0] << ", " << run.set1_outer[1] << ", " << run.set1_outer[2]
								   << ", " << run.set1_outer[3] << "]"
																   " and inner tess levels:"
																   "["
								   << run.set2_inner[0] << ", " << run.set2_inner[1] << "]"
																						", outer tess levels:"
																						"["
								   << run.set2_outer[0] << ", " << run.set2_outer[1] << ", " << run.set2_outer[2]
								   << ", " << run.set2_outer[3] << "]"
																   ", primitive mode: triangles, vertex spacing: "
								   << vs_mode_string << tcu::TestLog::EndMessage;

				TCU_FAIL("Amount of vertices generated by tessellator differs between base and references passes");
			}

			run.n_vertices = n_set1_vertices;

			run.set1_data = m_utils->getDataGeneratedByTessellator(run.set1_inner, false, /* is_point_mode_enabled */
																   TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
																   TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
																   run.vertex_spacing, run.set1_outer);
			run.set2_data = m_utils->getDataGeneratedByTessellator(run.set2_inner, false, /* is_point_mode_enabled */
																   TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
																   TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
																   run.vertex_spacing, run.set2_outer);

			/* Store the run data */
			m_runs.push_back(run);
		} /* for (all sets) */
	}	 /* for (all vertex spacing modes) */
}